

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarView::keyPressEvent(QCalendarView *this,QKeyEvent *event)

{
  int iVar1;
  QKeyEvent *in_RSI;
  long in_RDI;
  QKeyEvent *in_stack_00000078;
  QAbstractItemView *in_stack_00000080;
  
  if (((*(byte *)(in_RDI + 0x28) & 1) == 0) &&
     ((iVar1 = QKeyEvent::key(in_RSI), iVar1 + 0xfefffffcU < 2 || (iVar1 == 0x1010000)))) {
    editingFinished((QCalendarView *)0x51a5e7);
  }
  else {
    QAbstractItemView::keyPressEvent(in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

void QCalendarView::keyPressEvent(QKeyEvent *event)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (event->key() == Qt::Key_Select) {
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (!hasEditFocus()) {
                setEditFocus(true);
                return;
            }
        }
    } else if (event->key() == Qt::Key_Back) {
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()) {
            if (qobject_cast<QCalendarModel *>(model())) {
                emit changeDate(origDate, true); //changes selection back to origDate, but doesn't activate
                setEditFocus(false);
                return;
            }
        }
    }
#endif

    if (!readOnly) {
        switch (event->key()) {
            case Qt::Key_Return:
            case Qt::Key_Enter:
            case Qt::Key_Select:
                emit editingFinished();
                return;
            default:
                break;
        }
    }
    QTableView::keyPressEvent(event);
}